

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmEvalChunk(jx9_vm *pVm,jx9_context *pCtx,SyString *pChunk,int iFlags,int bTrueReturn)

{
  SySet *pSVar1;
  sxi32 sVar2;
  sxi32 iFlags_00;
  void *pErrData;
  ProcConsumer xErr;
  jx9_value sResult;
  SySet local_58;
  
  local_58.nUsed = 0;
  local_58.nSize = 0;
  local_58.eSize = 0x18;
  local_58.nCursor = 0;
  local_58.pBase = (void *)0x0;
  local_58.pUserData = (void *)0x0;
  local_58.pAllocator = &pVm->sAllocator;
  SySetAlloc(&local_58,0x20);
  if (iFlags == 0) {
    xErr = (ProcConsumer)0x0;
    pErrData = (void *)0x0;
  }
  else {
    xErr = (pVm->pEngine->xConf).xErr;
    pErrData = (pVm->pEngine->xConf).pErrData;
  }
  jx9ResetCodeGenerator(pVm,xErr,pErrData);
  pSVar1 = pVm->pByteContainer;
  pVm->pByteContainer = &local_58;
  jx9CompileScript(pVm,pChunk,iFlags_00);
  if ((pVm->sCodeGen).nErr == 0) {
    sVar2 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
    if (sVar2 == 0) {
      if (iFlags == 0) {
        jx9MemObjInit(pVm,&sResult);
      }
      else {
        jx9MemObjInitFromBool(pVm,&sResult,1);
      }
      VmLocalExec(pVm,&local_58,&sResult);
      if (pCtx != (jx9_context *)0x0) {
        jx9_result_value(pCtx,&sResult);
      }
      jx9MemObjRelease(&sResult);
      goto LAB_0012114f;
    }
  }
  if (pCtx != (jx9_context *)0x0) {
    jx9_result_bool(pCtx,0);
  }
LAB_0012114f:
  pVm->pByteContainer = pSVar1;
  sVar2 = SySetRelease(&local_58);
  return sVar2;
}

Assistant:

static sxi32 VmEvalChunk(
	jx9_vm *pVm,        /* Underlying Virtual Machine */
	jx9_context *pCtx,  /* Call Context */
	SyString *pChunk,   /* JX9 chunk to evaluate */ 
	int iFlags,         /* Compile flag */
	int bTrueReturn     /* TRUE to return execution result */
	)
{
	SySet *pByteCode, aByteCode;
	ProcConsumer xErr = 0;
	void *pErrData = 0;
	/* Initialize bytecode container */
	SySetInit(&aByteCode, &pVm->sAllocator, sizeof(VmInstr));
	SySetAlloc(&aByteCode, 0x20);
	/* Reset the code generator */
	if( bTrueReturn ){
		/* Included file, log compile-time errors */
		xErr = pVm->pEngine->xConf.xErr;
		pErrData = pVm->pEngine->xConf.pErrData;
	}
	jx9ResetCodeGenerator(pVm, xErr, pErrData);
	/* Swap bytecode container */
	pByteCode = pVm->pByteContainer;
	pVm->pByteContainer = &aByteCode;
	/* Compile the chunk */
	jx9CompileScript(pVm, pChunk, iFlags);
	if( pVm->sCodeGen.nErr > 0 ){
		/* Compilation error, return false */
		if( pCtx ){
			jx9_result_bool(pCtx, 0);
		}
	}else{
		jx9_value sResult; /* Return value */
		if( SXRET_OK != jx9VmEmitInstr(pVm, JX9_OP_DONE, 0, 0, 0, 0) ){
			/* Out of memory */
			if( pCtx ){
				jx9_result_bool(pCtx, 0);
			}
			goto Cleanup;
		}
		if( bTrueReturn ){
			/* Assume a boolean true return value */
			jx9MemObjInitFromBool(pVm, &sResult, 1);
		}else{
			/* Assume a null return value */
			jx9MemObjInit(pVm, &sResult);
		}
		/* Execute the compiled chunk */
		VmLocalExec(pVm, &aByteCode, &sResult);
		if( pCtx ){
			/* Set the execution result */
			jx9_result_value(pCtx, &sResult);
		}
		jx9MemObjRelease(&sResult);
	}
Cleanup:
	/* Cleanup the mess left behind */
	pVm->pByteContainer = pByteCode;
	SySetRelease(&aByteCode);
	return SXRET_OK;
}